

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.cpp
# Opt level: O0

void __thiscall IfStatement::evaluate(IfStatement *this,SymTab *symTab)

{
  int iVar1;
  undefined4 extraout_var;
  SymTab *symTab_local;
  IfStatement *this_local;
  
  if ((this->_cond == (ExprNode *)0x0) ||
     (iVar1 = (*this->_cond->_vptr_ExprNode[1])(this->_cond,symTab),
     0.0 < *(double *)(CONCAT44(extraout_var,iVar1) + 8))) {
    Statements::evaluate(this->_stmts,symTab);
  }
  else if (this->_elif != (IfStatement *)0x0) {
    (*(this->_elif->super_Statement)._vptr_Statement[1])(this->_elif,symTab);
  }
  return;
}

Assistant:

void IfStatement::evaluate(SymTab &symTab) {
    if((_cond == nullptr) || (_cond->evaluate(symTab)->_number > 0)) _stmts->evaluate(symTab);
    else if(_elif != nullptr) _elif->evaluate(symTab);
//    std::vector<std::pair<ExprNode *, Statements *>> testsAndSuites = getTestsAndSuites();
//    int i = 0;
//    bool elseStatement = true;
//    while(i < testsAndSuites.size()){
//        if (testsAndSuites[i].first == nullptr) {i++; continue;}
//        if(testsAndSuites[i].first->evaluate(symTab)->getNumber() != 0) {
//            testsAndSuites[i].second->evaluate(symTab);
//            elseStatement = false;
//        }
//        i++;
//    }
//    if (elseStatement)
//        testsAndSuites[i-1].second->evaluate(symTab);
}